

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::vector<pbrt::LightBVHNode,_pstd::pmr::polymorphic_allocator<pbrt::LightBVHNode>_>::reserve
          (vector<pbrt::LightBVHNode,_pstd::pmr::polymorphic_allocator<pbrt::LightBVHNode>_> *this,
          size_t n)

{
  LightBVHNode *pLVar1;
  iterator pLVar2;
  ulong in_RSI;
  vector<pbrt::LightBVHNode,_pstd::pmr::polymorphic_allocator<pbrt::LightBVHNode>_> *in_RDI;
  int i;
  LightBVHNode *ra;
  LightBVHNode *in_stack_ffffffffffffffc8;
  LightBVHNode *in_stack_ffffffffffffffd0;
  int local_1c;
  
  if (in_RDI->nAlloc < in_RSI) {
    pLVar1 = pmr::polymorphic_allocator<pbrt::LightBVHNode>::allocate_object<pbrt::LightBVHNode>
                       ((polymorphic_allocator<pbrt::LightBVHNode> *)in_stack_ffffffffffffffd0,
                        (size_t)in_stack_ffffffffffffffc8);
    for (local_1c = 0; (ulong)(long)local_1c < in_RDI->nStored; local_1c = local_1c + 1) {
      in_stack_ffffffffffffffd0 = pLVar1 + local_1c;
      pLVar2 = begin(in_RDI);
      pmr::polymorphic_allocator<pbrt::LightBVHNode>::
      construct<pbrt::LightBVHNode,pbrt::LightBVHNode>
                (&in_RDI->alloc,in_stack_ffffffffffffffd0,pLVar2 + local_1c);
      pLVar2 = begin(in_RDI);
      pmr::polymorphic_allocator<pbrt::LightBVHNode>::destroy<pbrt::LightBVHNode>
                (&in_RDI->alloc,pLVar2 + local_1c);
    }
    pmr::polymorphic_allocator<pbrt::LightBVHNode>::deallocate_object<pbrt::LightBVHNode>
              ((polymorphic_allocator<pbrt::LightBVHNode> *)in_stack_ffffffffffffffd0,
               in_stack_ffffffffffffffc8,0x8e6b44);
    in_RDI->nAlloc = in_RSI;
    in_RDI->ptr = pLVar1;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }